

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

int __thiscall Fl_Help_View::load(Fl_Help_View *this,char *f)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_t __n;
  int *piVar3;
  char local_1448 [8];
  char urimsg [2048];
  char newname [2048];
  char error [1024];
  char *localname;
  char *slash;
  char *target;
  long len;
  FILE *fp;
  char *f_local;
  Fl_Help_View *this_local;
  
  iVar1 = strncmp(f,"ftp:",4);
  if (((((iVar1 == 0) || (iVar1 = strncmp(f,"http:",5), iVar1 == 0)) ||
       (iVar1 = strncmp(f,"https:",6), iVar1 == 0)) ||
      ((iVar1 = strncmp(f,"ipp:",4), iVar1 == 0 || (iVar1 = strncmp(f,"mailto:",7), iVar1 == 0))))
     || (iVar1 = strncmp(f,"news:",5), iVar1 == 0)) {
    iVar1 = fl_open_uri(f,local_1448,0x800);
    if (iVar1 == 0) {
      clear_selection(this);
      fl_strlcpy(urimsg + 0x7f8,f,0x800);
      pcVar2 = strrchr(urimsg + 0x7f8,0x23);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      if (this->link_ == (Fl_Help_Func *)0x0) {
        error._1016_8_ = this->filename_;
      }
      else {
        error._1016_8_ = (*this->link_)((Fl_Widget *)this,urimsg + 0x7f8);
      }
      if (error._1016_8_ != 0) {
        free_data(this);
        fl_strlcpy(this->filename_,urimsg + 0x7f8,0x800);
        fl_strlcpy(this->directory_,urimsg + 0x7f8,0x800);
        pcVar2 = strrchr(this->directory_,0x2f);
        if (pcVar2 == (char *)0x0) {
          this->directory_[0] = '\0';
        }
        else if ((this->directory_ < pcVar2) && (pcVar2[-1] != '/')) {
          *pcVar2 = '\0';
        }
        snprintf(newname + 0x7f8,0x400,
                 "<HTML><HEAD><TITLE>Error</TITLE></HEAD><BODY><H1>Error</H1><P>Unable to follow the link \"%s\" - %s.</P></BODY>"
                 ,f,local_1448);
        value(this,newname + 0x7f8);
      }
    }
  }
  else {
    clear_selection(this);
    fl_strlcpy(urimsg + 0x7f8,f,0x800);
    pcVar2 = strrchr(urimsg + 0x7f8,0x23);
    slash = pcVar2;
    if (pcVar2 != (char *)0x0) {
      slash = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    if (this->link_ == (Fl_Help_Func *)0x0) {
      error._1016_8_ = this->filename_;
    }
    else {
      error._1016_8_ = (*this->link_)((Fl_Widget *)this,urimsg + 0x7f8);
    }
    if (error._1016_8_ != 0) {
      free_data(this);
      fl_strlcpy(this->filename_,urimsg + 0x7f8,0x800);
      fl_strlcpy(this->directory_,urimsg + 0x7f8,0x800);
      pcVar2 = strrchr(this->directory_,0x2f);
      if (pcVar2 == (char *)0x0) {
        this->directory_[0] = '\0';
      }
      else if ((this->directory_ < pcVar2) && (pcVar2[-1] != '/')) {
        *pcVar2 = '\0';
      }
      iVar1 = strncmp((char *)error._1016_8_,"file:",5);
      if (iVar1 == 0) {
        error._1016_8_ = error._1016_8_ + 5;
      }
      __stream = (FILE *)fl_fopen((char *)error._1016_8_,"rb");
      if (__stream == (FILE *)0x0) {
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        snprintf(newname + 0x7f8,0x400,
                 "<HTML><HEAD><TITLE>Error</TITLE></HEAD><BODY><H1>Error</H1><P>Unable to follow the link \"%s\" - %s.</P></BODY>"
                 ,error._1016_8_,pcVar2);
        pcVar2 = strdup(newname + 0x7f8);
        this->value_ = pcVar2;
      }
      else {
        fseek(__stream,0,2);
        __n = ftell(__stream);
        rewind(__stream);
        pcVar2 = (char *)calloc(__n + 1,1);
        this->value_ = pcVar2;
        fread(this->value_,1,__n,__stream);
        fclose(__stream);
      }
      initial_load = '\x01';
      format(this);
      initial_load = '\0';
      if (slash == (char *)0x0) {
        topline(this,0);
      }
      else {
        topline(this,slash);
      }
    }
  }
  return 0;
}

Assistant:

int				// O - 0 on success, -1 on error
Fl_Help_View::load(const char *f)// I - Filename to load (may also have target)
{
  FILE		*fp;		// File to read from
  long		len;		// Length of file
  char		*target;	// Target in file
  char		*slash;		// Directory separator
  const char	*localname;	// Local filename
  char		error[1024];	// Error buffer
  char		newname[FL_PATH_MAX];	// New filename buffer

  // printf("load(%s)\n",f); fflush(stdout);

  if (strncmp(f, "ftp:", 4) == 0 ||
      strncmp(f, "http:", 5) == 0 ||
      strncmp(f, "https:", 6) == 0 ||
      strncmp(f, "ipp:", 4) == 0 ||
      strncmp(f, "mailto:", 7) == 0 ||
      strncmp(f, "news:", 5) == 0) {
    char urimsg[FL_PATH_MAX];
    if ( fl_open_uri(f, urimsg, sizeof(urimsg)) == 0 ) {
      clear_selection();

      strlcpy(newname, f, sizeof(newname));
      if ((target = strrchr(newname, '#')) != NULL)
	*target++ = '\0';

      if (link_)
	localname = (*link_)(this, newname);
      else
	localname = filename_;

      if (!localname)
	return (0);

      free_data();

      strlcpy(filename_, newname, sizeof(filename_));
      strlcpy(directory_, newname, sizeof(directory_));

      // Note: We do not support Windows backslashes, since they are illegal
      //       in URLs...
      if ((slash = strrchr(directory_, '/')) == NULL)
	directory_[0] = '\0';
      else if (slash > directory_ && slash[-1] != '/')
	*slash = '\0';

      snprintf(error, sizeof(error),
	       "<HTML><HEAD><TITLE>Error</TITLE></HEAD>"
	       "<BODY><H1>Error</H1>"
	       "<P>Unable to follow the link \"%s\" - "
	       "%s.</P></BODY>",
	       f, urimsg);
      value(error);
      //return(-1);
    }
    return(0);
  }

  clear_selection();

  strlcpy(newname, f, sizeof(newname));
  if ((target = strrchr(newname, '#')) != NULL)
    *target++ = '\0';

  if (link_)
    localname = (*link_)(this, newname);
  else
    localname = filename_;

  if (!localname)
    return (0);

  free_data();

  strlcpy(filename_, newname, sizeof(filename_));
  strlcpy(directory_, newname, sizeof(directory_));

  // Note: We do not support Windows backslashes, since they are illegal
  //       in URLs...
  if ((slash = strrchr(directory_, '/')) == NULL)
    directory_[0] = '\0';
  else if (slash > directory_ && slash[-1] != '/')
    *slash = '\0';

  if (strncmp(localname, "file:", 5) == 0)
    localname += 5;	// Adjust for local filename...

  if ((fp = fl_fopen(localname, "rb")) != NULL)
  {
    fseek(fp, 0, SEEK_END);
    len = ftell(fp);
    rewind(fp);

    value_ = (const char *)calloc(len + 1, 1);
    if (fread((void *)value_, 1, len, fp)==0) { /* use default 0 */ }
    fclose(fp);
  }
  else
  {
    snprintf(error, sizeof(error),
	     "<HTML><HEAD><TITLE>Error</TITLE></HEAD>"
	     "<BODY><H1>Error</H1>"
	     "<P>Unable to follow the link \"%s\" - "
	     "%s.</P></BODY>",
	     localname, strerror(errno));
    value_ = strdup(error);
  }

  initial_load = 1;
  format();
  initial_load = 0;

  if (target)
    topline(target);
  else
    topline(0);

  return (0);
}